

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

void __thiscall QUrlPrivate::~QUrlPrivate(QUrlPrivate *this)

{
  std::unique_ptr<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>::~unique_ptr
            (&this->error);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->fragment).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->query).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->path).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->host).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->password).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->userName).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->scheme).d);
  return;
}

Assistant:

inline QUrlPrivate::~QUrlPrivate()
    = default;